

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

int main(int argc,char **argv)

{
  int status;
  uint uVar1;
  lua_State *L;
  
  L = luaL_newstate();
  if (L == (lua_State *)0x0) {
    l_message(*argv,"cannot create state: not enough memory");
    uVar1 = 1;
  }
  else {
    smain_0 = argv;
    smain_1 = argc;
    status = lua_cpcall(L,pmain,(void *)0x0);
    report(L,status);
    lua_close(L);
    uVar1 = (uint)(0 < smain_2 || status != 0);
  }
  return uVar1;
}

Assistant:

int main(int argc, char **argv)
{
  int status;
  lua_State *L = lua_open();
  if (L == NULL) {
    l_message(argv[0], "cannot create state: not enough memory");
    return EXIT_FAILURE;
  }
  smain.argc = argc;
  smain.argv = argv;
  status = lua_cpcall(L, pmain, NULL);
  report(L, status);
  lua_close(L);
  return (status || smain.status > 0) ? EXIT_FAILURE : EXIT_SUCCESS;
}